

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O0

double mjs::anon_unknown_37::date_helper::time_from_date_time(date_time *dt)

{
  date_time *this;
  double dVar1;
  double time;
  date_time *dt_local;
  
  this = dt;
  dVar1 = make_day(dt->year,dt->month,dt->day);
  time = make_time((date_helper *)this,dt->h,dt->m,dt->s,dt->ms);
  dVar1 = make_date(dVar1,time);
  return dVar1;
}

Assistant:

static double time_from_date_time(const date_time& dt) {
        return make_date(make_day(dt.year, dt.month, dt.day), make_time(dt.h, dt.m, dt.s, dt.ms));
    }